

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue.c
# Opt level: O3

void cf_task_queue_delete(cf_task_queue_t *self)

{
  cf_mutex_t *mutex;
  
  self->exit = 1;
  cf_event_set(self->notify);
  cf_thread_join(self->thread,(cf_uint32_t *)0x0);
  mutex = &self->mutex;
  cf_mutex_lock(mutex);
  cf_lite_queue_deinit(&self->tasks);
  cf_array_deinit(&self->delayed_tasks);
  cf_event_delete(self->notify);
  cf_mutex_unlock(mutex);
  cf_mutex_destroy(mutex);
  cf_free_dbg(self,
              "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/task_queue.c"
              ,"cf_task_queue_delete",0x9e);
  return;
}

Assistant:

void cf_task_queue_delete(cf_task_queue_t* self) {
    self->exit = CF_TRUE;
    cf_event_set(self->notify);

    cf_thread_join(self->thread, 0);
    cf_mutex_lock(&self->mutex);
    {
        cf_lite_queue_deinit(&self->tasks);
        cf_array_deinit(&self->delayed_tasks);
        cf_event_delete(self->notify);
    }
    cf_mutex_unlock(&self->mutex);

    cf_mutex_destroy(&self->mutex);
    cf_free(self);
}